

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
mesh::createb(vector<float,_std::allocator<float>_> *__return_storage_ptr__,mesh *this,int r,int c,
             int m,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *volt,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *mcurrent)

{
  float fVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pfVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  allocator_type local_69 [29];
  value_type_conflict2 local_4c;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,(long)m,&local_4c,local_69);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(__return_storage_ptr__);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  uVar7 = 0;
  if (0 < r) {
    uVar7 = (ulong)(uint)r;
  }
  lVar9 = 4;
  for (uVar6 = 1; (long)uVar6 < (long)(c + -1); uVar6 = uVar6 + (long)(r + 1)) {
    for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      pvVar2 = (mcurrent->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (volt->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar4 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar8 = 0; (uint)r != uVar8; uVar8 = uVar8 + 1) {
        if (*(int *)(*(long *)&pvVar2[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + lVar9 + uVar8 * 4) == 1) {
          fVar1 = *(float *)(*(long *)&pvVar3[uVar10].
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data + uVar8 * 4);
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            iVar5 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                         (long)r);
            pfVar4[iVar5] = fVar1 + pfVar4[iVar5];
          }
        }
      }
    }
    lVar9 = lVar9 + (long)(r + 1) * 4;
  }
  return __return_storage_ptr__;
}

Assistant:

auto createb( int r, int c, int m, std::vector<std::vector<float>> &volt, std::vector<std::vector<int>> &mcurrent)
    {
        std::vector<float> b;
        int i, j, k;
      //  std::vector<float> b;
        //initialise b to 0
        b=std::vector<float> (m, 0);

        for(k = 1; k < c-1; k += r+1)
        {
            for(i = 0; i < r; i++)
            {
                for(j = 0; j < r; j++)
                {
                    if(mcurrent[i][j+k]== 1 && volt[i][j]!=0)
                    {
                        b[k/r]+= volt[i][j];
                    }
                   // std::cerr << mcurrent[i][j+k] << " and " << volt[i][j] << "\n";

//                    std::cerr << mcurrent[i][j+k] << " and " <<volt[i][j] << "\t";
//                    std::cerr << "\n";
                 //   std::cerr << b[k/r] << "\n";
                }
            }
        }
        return b;

    }